

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

OBSOLETE_DistanceDisplayMode
ON_DimStyle::DistanceDisplayModeFromLengthFormat(OBSOLETE_length_format lf)

{
  undefined3 in_register_00000039;
  OBSOLETE_DistanceDisplayMode OVar1;
  
  OVar1 = CONCAT31(in_register_00000039,lf) == 1;
  if (CONCAT31(in_register_00000039,lf) == 2) {
    OVar1 = FeetInches;
  }
  return OVar1;
}

Assistant:

ON::OBSOLETE_DistanceDisplayMode ON_DimStyle::DistanceDisplayModeFromLengthFormat(
  ON_DimStyle::OBSOLETE_length_format lf
  )
{
  ON::OBSOLETE_DistanceDisplayMode ddm;
  switch (lf)
  {
  case ON_DimStyle::OBSOLETE_length_format::Decimal:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Decimal;
    break;
  case ON_DimStyle::OBSOLETE_length_format::Fractional:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Fractional;
    break;
  case ON_DimStyle::OBSOLETE_length_format::FeetInches:
    ddm = ON::OBSOLETE_DistanceDisplayMode::FeetInches;
    break;
  default:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Decimal;
    break;
  }
  return ddm;
}